

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_column_data.cpp
# Opt level: O1

bool __thiscall duckdb::StandardColumnData::IsPersistent(StandardColumnData *this)

{
  ColumnSegment *segment;
  __pointer_type pCVar1;
  ColumnSegment *segment_1;
  bool bVar2;
  
  for (pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                          (&(this->super_ColumnData).data.
                            super_SegmentTree<duckdb::ColumnSegment,_false>);
      (pCVar1 != (ColumnSegment *)0x0 && (pCVar1->segment_type == PERSISTENT));
      pCVar1 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
  }
  if (pCVar1 != (ColumnSegment *)0x0) {
    bVar2 = false;
  }
  else {
    for (pCVar1 = SegmentTree<duckdb::ColumnSegment,_false>::GetRootSegment
                            (&(this->validity).super_ColumnData.data.
                              super_SegmentTree<duckdb::ColumnSegment,_false>);
        (bVar2 = pCVar1 == (ColumnSegment *)0x0, !bVar2 && (pCVar1->segment_type == PERSISTENT));
        pCVar1 = (pCVar1->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p) {
    }
  }
  return bVar2;
}

Assistant:

bool StandardColumnData::IsPersistent() {
	return ColumnData::IsPersistent() && validity.IsPersistent();
}